

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.h
# Opt level: O3

void __thiscall
agge::tests::mocks::renderer_adapter<unsigned_short>::operator()
          (renderer_adapter<unsigned_short> *this,int x,count_t length,cover_type_conflict1 *covers)

{
  pointer *pppVar1;
  iterator __position;
  render_log_entry e;
  value_type local_48;
  undefined1 local_38 [8];
  pointer local_30;
  
  local_38._0_4_ = x;
  std::vector<unsigned_short,std::allocator<unsigned_short>>::vector<unsigned_short_const*>
            ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_30,covers,
             covers + length,(allocator_type *)&local_48);
  std::
  vector<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry,_std::allocator<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry>_>
  ::push_back(&this->render_log,(value_type *)local_38);
  __position._M_current =
       (this->raw_render_log).
       super__Vector_base<std::pair<const_unsigned_short_*,_unsigned_int>,_std::allocator<std::pair<const_unsigned_short_*,_unsigned_int>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.first = covers;
  local_48.second = length;
  if (__position._M_current ==
      (this->raw_render_log).
      super__Vector_base<std::pair<const_unsigned_short_*,_unsigned_int>,_std::allocator<std::pair<const_unsigned_short_*,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::pair<const_unsigned_short_*,_unsigned_int>,_std::allocator<std::pair<const_unsigned_short_*,_unsigned_int>_>_>
    ::_M_realloc_insert(&this->raw_render_log,__position,&local_48);
  }
  else {
    (__position._M_current)->first = covers;
    *(ulong *)&(__position._M_current)->second = CONCAT44(local_48._12_4_,length);
    pppVar1 = &(this->raw_render_log).
               super__Vector_base<std::pair<const_unsigned_short_*,_unsigned_int>,_std::allocator<std::pair<const_unsigned_short_*,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  if (local_30 != (pointer)0x0) {
    operator_delete(local_30);
  }
  return;
}

Assistant:

void operator ()(int x, count_t length, const cover_type *covers)
				{
					using namespace std;

					render_log_entry e = { x, vector<cover_type>(covers, covers + length) };
					render_log.push_back(e);
					raw_render_log.push_back(make_pair(covers, length));
				}